

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingManager.cpp
# Opt level: O0

AbstractLoggingDevice * __thiscall
SLogLib::LoggingManager::QueryDevice(LoggingManager *this,string *deviceName)

{
  LoggingManagerPriv *this_00;
  lock_guard<std::mutex> __lhs;
  bool bVar1;
  reference ppAVar2;
  __type local_79;
  AbstractLoggingDevice local_68 [2];
  AbstractLoggingDevice *local_48;
  AbstractLoggingDevice *_device;
  iterator __end1;
  iterator __begin1;
  list<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
  *__range1;
  lock_guard<std::mutex> _lock;
  string *deviceName_local;
  LoggingManager *this_local;
  
  _lock._M_device = (mutex_type *)deviceName;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&__range1,&this->mPriv->mLoggingDevicesMutex);
  this_00 = this->mPriv;
  __end1 = std::__cxx11::
           list<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
           ::begin(&this_00->mLoggingDevices);
  _device = (AbstractLoggingDevice *)
            std::__cxx11::
            list<SLogLib::AbstractLoggingDevice_*,_std::allocator<SLogLib::AbstractLoggingDevice_*>_>
            ::end(&this_00->mLoggingDevices);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&_device);
    if (!bVar1) {
      this_local = (LoggingManager *)0x0;
LAB_0010e1b8:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range1);
      return (AbstractLoggingDevice *)this_local;
    }
    ppAVar2 = std::_List_iterator<SLogLib::AbstractLoggingDevice_*>::operator*(&__end1);
    __lhs = _lock;
    local_48 = *ppAVar2;
    local_79 = false;
    if (local_48 != (AbstractLoggingDevice *)0x0) {
      AbstractLoggingDevice::Name_abi_cxx11_(local_68);
      local_79 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__lhs._M_device,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68);
      std::__cxx11::string::~string((string *)local_68);
    }
    if (local_79 != false) {
      this_local = (LoggingManager *)local_48;
      goto LAB_0010e1b8;
    }
    std::_List_iterator<SLogLib::AbstractLoggingDevice_*>::operator++(&__end1);
  } while( true );
}

Assistant:

AbstractLoggingDevice* LoggingManager::QueryDevice(const std::string& deviceName)
{
	// Lock must be here because another thread can add/remove 
	// a new device while the for loop is running.
	std::lock_guard<std::mutex> _lock(mPriv->mLoggingDevicesMutex);
	
	for(AbstractLoggingDevice* _device : mPriv->mLoggingDevices)
	{
		if(_device && deviceName == _device->Name())
		{
			return _device;
		}
	}
	return nullptr;
}